

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPToState::operator()
          (StoreLPToState *this,iterator_t *str,iterator_t end)

{
  parsed_t pVar1;
  uint uVar2;
  ParserPOMDPFormat_Spirit *pPVar3;
  pointer puVar4;
  ulong uVar5;
  ostream *poVar6;
  E *pEVar7;
  uint *__x;
  E e;
  stringstream ss;
  ostream local_198 [376];
  
  pPVar3 = this->_m_po;
  puVar4 = (pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  pVar1 = pPVar3->_m_lp_type;
  if (pVar1 == ASTERICK) {
    __x = &pPVar3->_m_anyStateIndex;
  }
  else {
    if (pVar1 == STRING) {
      _ss = MADPComponentDiscreteStates::GetStateIndexByName
                      (&(pPVar3->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                        super_MultiAgentDecisionProcessDiscrete._m_S,&pPVar3->_m_lp_string);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->_m_po->_m_lp_toSI,(value_type_conflict1 *)&ss);
      return;
    }
    if (pVar1 != UINT) {
      pEVar7 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar7,
           "StoreLPToState expected that the last parsed type is a state index(uint), state name (string) or wilcard (\'*\')."
          );
      __cxa_throw(pEVar7,&E::typeinfo,E::~E);
    }
    uVar2 = pPVar3->_m_lp_uint;
    uVar5 = (**(code **)(*(long *)&(pPVar3->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscrete.
                                   super_MultiAgentDecisionProcess + 0x30))();
    if (uVar5 <= uVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_198,"StoreLPToState: \'");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,"\' is not a valid state index!? Number of states is ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," (at ");
      poVar6 = POMDPFormatParsing::operator<<(poVar6,&str->_pos);
      poVar6 = std::operator<<(poVar6,")");
      std::endl<char,std::char_traits<char>>(poVar6);
      pEVar7 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar7,&ss);
      __cxa_throw(pEVar7,&E::typeinfo,E::~E);
    }
    pPVar3 = this->_m_po;
    __x = &pPVar3->_m_lp_uint;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pPVar3->_m_lp_toSI,__x);
  return;
}

Assistant:

void ParserPOMDPFormat_Spirit::StoreLPToState::operator()(iterator_t str, iterator_t end) const
{
    if(DEBUG_POMDP_PARSE)
        cout << "StoreLPToState: pushing "<<string(str,end)<< " on __m_po->_m_lp_sI"<<endl;
    //we are parsing a new to state - the previous is not valid
    //any more, so we clear the state index vector
    _m_po->_m_lp_toSI.clear();
    if(_m_po->_m_lp_type == UINT)
    {
        unsigned int index = _m_po->_m_lp_uint;
        size_t nrS =  _m_po->GetPOMDPDiscrete()->GetNrStates();
        if(index >= nrS)
        {            
            stringstream ss; ss<<"StoreLPToState: '"<< index<< "' is not a valid state index!? Number of states is " << nrS <<" (at " <<str.get_position()<<")"<<endl; throw E(ss);
        }

        _m_po->_m_lp_toSI.push_back( _m_po->_m_lp_uint );
    }
    else if(_m_po->_m_lp_type == STRING)
    {
        try
        {
            Index sI = _m_po->GetPOMDPDiscrete()->GetStateIndexByName(
                _m_po->_m_lp_string);
            _m_po->_m_lp_toSI.push_back(sI);
        }
        catch(E e)
        {
            stringstream ermsg; ermsg << e.SoftPrint() << " (at " << 
                str.get_position() << ")"<<endl;
            throw E(ermsg);
        }
    }
    else if(_m_po->_m_lp_type == ASTERICK )
        _m_po->_m_lp_toSI.push_back(_m_po->_m_anyStateIndex);
    else
        throw E("StoreLPToState expected that the last parsed type is a state index(uint), state name (string) or wilcard ('*').");
}